

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

upb_DecodeStatus
upb_Decoder_Decode(upb_Decoder *decoder,char *buf,upb_Message *msg,upb_MiniTable *m,upb_Arena *arena
                  )

{
  int iVar1;
  upb_DecodeStatus uVar2;
  
  iVar1 = _setjmp((__jmp_buf_tag *)decoder->err);
  if (iVar1 == 0) {
    _upb_Decoder_DecodeMessage(decoder,buf,msg,m);
    uVar2 = kUpb_DecodeStatus_Malformed;
    if (decoder->end_group == 0xffffffff) {
      uVar2 = (uint)decoder->missing_required + (uint)decoder->missing_required * 4;
    }
    decoder->status = uVar2;
  }
  else if (decoder->status == kUpb_DecodeStatus_Ok) {
    __assert_fail("decoder->status != kUpb_DecodeStatus_Ok",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/wire/decode.c"
                  ,0x55b,
                  "upb_DecodeStatus upb_Decoder_Decode(upb_Decoder *const, const char *const, upb_Message *const, const upb_MiniTable *const, upb_Arena *const)"
                 );
  }
  _upb_Arena_SwapOut_dont_copy_me__upb_internal_use_only(arena,&(decoder->field_8).arena);
  return decoder->status;
}

Assistant:

static upb_DecodeStatus upb_Decoder_Decode(upb_Decoder* const decoder,
                                           const char* const buf,
                                           upb_Message* const msg,
                                           const upb_MiniTable* const m,
                                           upb_Arena* const arena) {
  if (UPB_SETJMP(decoder->err) == 0) {
    decoder->status = _upb_Decoder_DecodeTop(decoder, buf, msg, m);
  } else {
    UPB_ASSERT(decoder->status != kUpb_DecodeStatus_Ok);
  }

  UPB_PRIVATE(_upb_Arena_SwapOut)(arena, &decoder->arena);

  return decoder->status;
}